

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O2

void __thiscall iutest::TestProperty::TestProperty(TestProperty *this,string *key,string *value)

{
  std::__cxx11::string::string((string *)this,(string *)key);
  std::__cxx11::string::string((string *)&this->m_value,(string *)value);
  return;
}

Assistant:

TestProperty(const ::std::string& key, const ::std::string& value)
        : m_key(key), m_value(value) {}